

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkleblock.cpp
# Opt level: O3

void __thiscall
CPartialMerkleTree::TraverseAndBuild
          (CPartialMerkleTree *this,int height,uint pos,
          vector<uint256,_std::allocator<uint256>_> *vTxid,
          vector<bool,_std::allocator<bool>_> *vMatch)

{
  pointer *ppuVar1;
  uchar *puVar2;
  pointer puVar3;
  iterator __position;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  int height_00;
  uint uVar7;
  byte bVar8;
  long in_FS_OFFSET;
  bool bVar9;
  uint256 local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = this->nTransactions;
  do {
    uVar5 = pos << ((byte)height & 0x1f);
    uVar7 = pos + 1 << ((byte)height & 0x1f);
    if (uVar6 <= uVar7) {
      uVar7 = uVar6;
    }
    if (uVar7 <= uVar5) {
      std::vector<bool,_std::allocator<bool>_>::push_back(&this->vBits,false);
      if (height == 0) goto LAB_00694f8e;
LAB_00694f75:
      CalcHash(&local_58,this,height,pos,vTxid);
LAB_00694fb5:
      __position._M_current =
           (this->vHash).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->vHash).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<uint256,_std::allocator<uint256>_>::_M_realloc_insert<uint256>
                  (&this->vHash,__position,&local_58);
      }
      else {
        *(undefined8 *)(((__position._M_current)->super_base_blob<256U>).m_data._M_elems + 0x10) =
             local_58.super_base_blob<256U>.m_data._M_elems._16_8_;
        *(undefined8 *)(((__position._M_current)->super_base_blob<256U>).m_data._M_elems + 0x18) =
             local_58.super_base_blob<256U>.m_data._M_elems._24_8_;
        *(undefined8 *)((__position._M_current)->super_base_blob<256U>).m_data._M_elems =
             local_58.super_base_blob<256U>.m_data._M_elems._0_8_;
        *(undefined8 *)(((__position._M_current)->super_base_blob<256U>).m_data._M_elems + 8) =
             local_58.super_base_blob<256U>.m_data._M_elems._8_8_;
        ppuVar1 = &(this->vHash).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
      break;
    }
    bVar4 = 0;
    do {
      bVar8 = bVar4;
      bVar9 = ((vMatch->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data
               ._M_start.super__Bit_iterator_base._M_p[uVar5 >> 6] >> ((ulong)uVar5 & 0x3f) & 1) !=
              0;
      uVar5 = uVar5 + 1;
      bVar4 = bVar8 | bVar9;
    } while (uVar7 != uVar5);
    std::vector<bool,_std::allocator<bool>_>::push_back(&this->vBits,(bool)(bVar8 | bVar9));
    height_00 = height + -1;
    if (height == 0) {
LAB_00694f8e:
      puVar3 = (vTxid->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((vTxid->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
          super__Vector_impl_data._M_finish == puVar3) {
        __assert_fail("vTxid.size() != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/merkleblock.cpp"
                      ,0x3d,
                      "uint256 CPartialMerkleTree::CalcHash(int, unsigned int, const std::vector<uint256> &)"
                     );
      }
      local_58.super_base_blob<256U>.m_data._M_elems._0_8_ =
           *(undefined8 *)puVar3[pos].super_base_blob<256U>.m_data._M_elems;
      local_58.super_base_blob<256U>.m_data._M_elems._8_8_ =
           *(undefined8 *)(puVar3[pos].super_base_blob<256U>.m_data._M_elems + 8);
      puVar2 = puVar3[pos].super_base_blob<256U>.m_data._M_elems + 0x10;
      local_58.super_base_blob<256U>.m_data._M_elems._16_8_ = *(undefined8 *)puVar2;
      local_58.super_base_blob<256U>.m_data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 8);
      goto LAB_00694fb5;
    }
    if (bVar8 == 0 && !bVar9) goto LAB_00694f75;
    TraverseAndBuild(this,height_00,pos * 2,vTxid,vMatch);
    uVar6 = this->nTransactions;
    pos = pos * 2 + 1;
    height = height_00;
  } while (pos < ~(-1 << ((byte)height_00 & 0x1f)) + uVar6 >> ((byte)height_00 & 0x1f));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CPartialMerkleTree::TraverseAndBuild(int height, unsigned int pos, const std::vector<uint256> &vTxid, const std::vector<bool> &vMatch) {
    // determine whether this node is the parent of at least one matched txid
    bool fParentOfMatch = false;
    for (unsigned int p = pos << height; p < (pos+1) << height && p < nTransactions; p++)
        fParentOfMatch |= vMatch[p];
    // store as flag bit
    vBits.push_back(fParentOfMatch);
    if (height==0 || !fParentOfMatch) {
        // if at height 0, or nothing interesting below, store hash and stop
        vHash.push_back(CalcHash(height, pos, vTxid));
    } else {
        // otherwise, don't store any hash, but descend into the subtrees
        TraverseAndBuild(height-1, pos*2, vTxid, vMatch);
        if (pos*2+1 < CalcTreeWidth(height-1))
            TraverseAndBuild(height-1, pos*2+1, vTxid, vMatch);
    }
}